

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

ags_t AGSSock::send_impl(Socket *sock,char *buf,size_t count)

{
  int *piVar1;
  ssize_t local_28;
  long ret;
  size_t count_local;
  char *buf_local;
  Socket *sock_local;
  
  local_28 = 0;
  ret = count;
  count_local = (size_t)buf;
  while ((ret != 0 && (local_28 = send(sock->id,(void *)count_local,ret,0), local_28 != -1))) {
    count_local = local_28 + count_local;
    ret = ret - local_28;
  }
  piVar1 = __errno_location();
  sock->error = *piVar1;
  if ((sock->error == 0xb) || (sock->error == 0xb)) {
    sock->error = 0;
  }
  return (long)(int)(uint)(local_28 != -1);
}

Assistant:

inline ags_t send_impl(Socket *sock, const char *buf, size_t count)
{
	long ret = 0;
	
	while (count > 0)
	{
		ret = send(sock->id, buf, count, 0);
		if (ret == SOCKET_ERROR)
			break;
		buf += ret;
		count -= ret;
	}
	
	sock->error = GET_ERROR();
	if (WOULD_BLOCK(sock->error))
		sock->error = 0;

	return (ret == SOCKET_ERROR ? 0 : 1);
}